

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

void __thiscall
qpdf::Stream::replaceStreamData
          (Stream *this,shared_ptr<QPDFObjectHandle::StreamDataProvider> *provider,
          QPDFObjectHandle *filter,QPDFObjectHandle *decode_parms)

{
  shared_ptr<Buffer> local_40;
  Members *local_30;
  Members *s;
  QPDFObjectHandle *decode_parms_local;
  QPDFObjectHandle *filter_local;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> *provider_local;
  Stream *this_local;
  
  s = (Members *)decode_parms;
  decode_parms_local = filter;
  filter_local = (QPDFObjectHandle *)provider;
  provider_local = (shared_ptr<QPDFObjectHandle::StreamDataProvider> *)this;
  local_30 = stream(this);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::operator=
            (&local_30->stream_provider,provider);
  std::shared_ptr<Buffer>::shared_ptr(&local_40,(nullptr_t)0x0);
  std::shared_ptr<Buffer>::operator=(&local_30->stream_data,&local_40);
  std::shared_ptr<Buffer>::~shared_ptr(&local_40);
  replaceFilterData(this,decode_parms_local,(QPDFObjectHandle *)s,0);
  return;
}

Assistant:

void
Stream::replaceStreamData(
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider> provider,
    QPDFObjectHandle const& filter,
    QPDFObjectHandle const& decode_parms)
{
    auto s = stream();
    s->stream_provider = provider;
    s->stream_data = nullptr;
    replaceFilterData(filter, decode_parms, 0);
}